

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O3

void transsub(quadtype nextquad)

{
  char label [10];
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  char local_32 [10];
  
  fwrite("; ",2,1,(FILE *)ofp);
  fprintlexeme(ofp,in_stack_00000010);
  fwrite(" := ",4,1,(FILE *)ofp);
  fprintlexeme(ofp,in_stack_00000018);
  fwrite(" - ",3,1,(FILE *)ofp);
  fprintlexeme(ofp,in_stack_00000020);
  fputc(10,(FILE *)ofp);
  getjumplabel(local_32);
  emitfromone(opcmov,"ax",in_stack_00000018);
  emitfromone(opcmov,"bx",in_stack_00000020);
  fwrite("         sub       ax, bx\n",0x1a,1,(FILE *)ofp);
  emittoone(opcmov,in_stack_00000010,"ax");
  fprintf((FILE *)ofp,"%s:\n\n",local_32);
  return;
}

Assistant:

void    transsub(struct quadtype nextquad)
{
    char    label[LABELSIZE];
    
    fprintf(ofp, "; ");
    fprintlexeme(ofp, nextquad.op1.opnd);
    fprintf(ofp, " := ");
    fprintlexeme(ofp, nextquad.op2.opnd);
    fprintf(ofp, " - ");
    fprintlexeme(ofp, nextquad.op3.opnd);
    fprintf(ofp, "\n");
    
    getjumplabel(label);
    emitfromone(opcmov, "ax", nextquad.op2.opnd);
    emitfromone(opcmov, "bx", nextquad.op3.opnd);
    fprintf(ofp, "         sub       ax, bx\n");
    //  fprintf(ofp, "         jc        iovrflo\n");
    emittoone(opcmov, nextquad.op1.opnd, "ax");
    
    fprintf(ofp, "%s:\n\n", label);
}